

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::RasterizationTests::init(RasterizationTests *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  GLenum GVar2;
  GLenum GVar3;
  RenderTarget target;
  int numSamples;
  Context *pCVar4;
  TestContext *testCtx;
  char *__s;
  bool bVar5;
  int extraout_EAX;
  TestNode *pTVar6;
  BaseRenderingCase *pBVar7;
  long *plVar8;
  long lVar9;
  TestNode *pTVar10;
  LineInterpolationTest *pLVar11;
  long *plVar12;
  bool bVar13;
  char *pcVar14;
  long lVar15;
  string name;
  allocator<char> local_c9;
  TestNode *local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  char *local_80;
  TestNode *local_78;
  long *local_70 [2];
  long local_60 [2];
  TestNode *local_50;
  long local_48;
  long local_40;
  TestNode *local_38;
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"primitives",
             "Primitive rasterization");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(this->super_TestCaseGroup).m_context,"triangles",
             "Render primitives as GL_TRIANGLES, verify rasterization result",RENDERTARGET_DEFAULT,
             -1,0x100);
  *(undefined8 *)&pBVar7->field_0xc4 = 0x300000000;
  *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 4;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_02139b18;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(this->super_TestCaseGroup).m_context,"triangle_strip",
             "Render primitives as GL_TRIANGLE_STRIP, verify rasterization result",
             RENDERTARGET_DEFAULT,-1,0x100);
  *(undefined8 *)&pBVar7->field_0xc4 = 0x300000000;
  *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 5;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_02139bf8;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(this->super_TestCaseGroup).m_context,"triangle_fan",
             "Render primitives as GL_TRIANGLE_FAN, verify rasterization result",
             RENDERTARGET_DEFAULT,-1,0x100);
  *(undefined8 *)&pBVar7->field_0xc4 = 0x300000000;
  *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 6;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_02139c60;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xf8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(this->super_TestCaseGroup).m_context,"lines",
             "Render primitives as GL_LINES, verify rasterization result",RENDERTARGET_DEFAULT,-1,
             0x100);
  *(undefined8 *)&pBVar7->field_0xc4 = 0x300000000;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 1;
  *(undefined2 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  *(undefined4 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       0x3f800000;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
       = 0;
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseLineCase_02139cc8;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xf8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(this->super_TestCaseGroup).m_context,"line_strip",
             "Render primitives as GL_LINE_STRIP, verify rasterization result",RENDERTARGET_DEFAULT,
             -1,0x100);
  *(undefined8 *)&pBVar7->field_0xc4 = 0x300000000;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined2 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  *(undefined4 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       0x3f800000;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
       = 0;
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseLineCase_02139d98;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xf8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(this->super_TestCaseGroup).m_context,"line_loop",
             "Render primitives as GL_LINE_LOOP, verify rasterization result",RENDERTARGET_DEFAULT,
             -1,0x100);
  *(undefined8 *)&pBVar7->field_0xc4 = 0x300000000;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 2;
  *(undefined2 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  *(undefined4 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       0x3f800000;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
       = 0;
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseLineCase_02139e00;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xf8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(this->super_TestCaseGroup).m_context,"lines_wide",
             "Render primitives as GL_LINES with wide lines, verify rasterization result",
             RENDERTARGET_DEFAULT,-1,0x100);
  *(undefined8 *)&pBVar7->field_0xc4 = 0x300000000;
  *(undefined1 **)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = &DAT_100000001;
  *(undefined2 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  *(undefined4 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       0x3f800000;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
       = 0;
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseLineCase_02139cc8;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xf8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(this->super_TestCaseGroup).m_context,"line_strip_wide",
             "Render primitives as GL_LINE_STRIP with wide lines, verify rasterization result",
             RENDERTARGET_DEFAULT,-1,0x100);
  *(undefined8 *)&pBVar7->field_0xc4 = 0x300000000;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 0x100000003;
  *(undefined2 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  *(undefined4 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       0x3f800000;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
       = 0;
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseLineCase_02139d98;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xf8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(this->super_TestCaseGroup).m_context,"line_loop_wide",
             "Render primitives as GL_LINE_LOOP with wide lines, verify rasterization result",
             RENDERTARGET_DEFAULT,-1,0x100);
  *(undefined8 *)&pBVar7->field_0xc4 = 0x300000000;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 0x100000002;
  *(undefined2 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  *(undefined4 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       0x3f800000;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
       = 0;
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseLineCase_02139e00;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xf0);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(this->super_TestCaseGroup).m_context,"points",
             "Render primitives as GL_POINTS, verify rasterization result",RENDERTARGET_DEFAULT,-1,
             0x100);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PointCase_02139e68;
  *(undefined8 *)&pBVar7->field_0xc4 = 0x300000000;
  *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 1;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
       0x3f800000;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fill_rules",
             "Primitive fill rules");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_02139ec8;
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,pCVar4,"basic_quad","Verify fill rules",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_02139ec8;
  *(undefined8 *)&pBVar7->field_0xc4 = 0;
  *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 2;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_02139ec8;
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,pCVar4,"basic_quad_reverse","Verify fill rules",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_02139ec8;
  *(undefined8 *)&pBVar7->field_0xc4 = 1;
  *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 2;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_02139ec8;
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,pCVar4,"clipped_full","Verify fill rules",RENDERTARGET_DEFAULT,-1,0x40);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_02139ec8;
  *(undefined8 *)&pBVar7->field_0xc4 = 2;
  *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 0xf;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_02139ec8;
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,pCVar4,"clipped_partly","Verify fill rules",RENDERTARGET_DEFAULT,-1,0x40);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_02139ec8;
  *(undefined8 *)&pBVar7->field_0xc4 = 3;
  *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 0xf;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_02139ec8;
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,pCVar4,"projected","Verify fill rules",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_02139ec8;
  *(undefined8 *)&pBVar7->field_0xc4 = 4;
  *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 2;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"culling",
             "Culling");
  local_38 = pTVar6;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  lVar15 = 0;
  local_50 = (TestNode *)this;
  do {
    local_78 = (TestNode *)(init::cullModes + lVar15);
    local_80 = init::cullModes[lVar15].prefix;
    lVar9 = 0;
    local_48 = lVar15;
    do {
      local_c8 = (TestNode *)(init::primitiveTypes + lVar9);
      lVar15 = 0;
      bVar5 = true;
      local_40 = lVar9;
      do {
        bVar13 = bVar5;
        std::__cxx11::string::string<std::allocator<char>>((string *)local_70,local_80,&local_c9);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_70);
        plVar12 = plVar8 + 2;
        if ((long *)*plVar8 == plVar12) {
          local_b0 = *plVar12;
          lStack_a8 = plVar8[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0 = *plVar12;
          local_c0 = (long *)*plVar8;
        }
        local_b8 = plVar8[1];
        *plVar8 = (long)plVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_c0);
        local_a0 = &local_90;
        plVar12 = plVar8 + 2;
        if ((long *)*plVar8 == plVar12) {
          local_90 = *plVar12;
          lStack_88 = plVar8[3];
        }
        else {
          local_90 = *plVar12;
          local_a0 = (long *)*plVar8;
        }
        local_98 = plVar8[1];
        *plVar8 = (long)plVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        pBVar7 = (BaseRenderingCase *)operator_new(0xd0);
        GVar1 = *(GLenum *)&local_78->_vptr_TestNode;
        GVar2 = *(GLenum *)&local_c8->_vptr_TestNode;
        GVar3 = init::frontOrders[lVar15].mode;
        anon_unknown_1::BaseRenderingCase::BaseRenderingCase
                  (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   (char *)local_a0,"Test primitive culling.",RENDERTARGET_DEFAULT,-1,0x100);
        (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__BaseRenderingCase_02139f28;
        *(GLenum *)&pBVar7->field_0xc4 = GVar1;
        *(GLenum *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = GVar2;
        *(GLenum *)
         ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = GVar3;
        tcu::TestNode::addChild(local_38,(TestNode *)pBVar7);
        this = (RasterizationTests *)local_50;
        if (local_a0 != &local_90) {
          operator_delete(local_a0,local_90 + 1);
        }
        lVar15 = 1;
        bVar5 = false;
      } while (bVar13);
      lVar9 = local_40 + 1;
    } while (lVar9 != 3);
    lVar15 = local_48 + 1;
  } while (lVar15 != 3);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"interpolation",
             "Test interpolation");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar10 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar10,((TestNode *)this)->m_testCtx,"basic",
             "Non-projective interpolation");
  tcu::TestNode::addChild(pTVar6,pTVar10);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
             "Verify triangle interpolation",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_02139f88;
  *(undefined4 *)&pBVar7->field_0xc4 = 4;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar7->m_flatshade = false;
  tcu::TestNode::addChild(pTVar10,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_strip",
             "Verify triangle strip interpolation",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_02139f88;
  *(undefined4 *)&pBVar7->field_0xc4 = 5;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar7->m_flatshade = false;
  tcu::TestNode::addChild(pTVar10,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_fan",
             "Verify triangle fan interpolation",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_02139f88;
  *(undefined4 *)&pBVar7->field_0xc4 = 6;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar7->m_flatshade = false;
  tcu::TestNode::addChild(pTVar10,(TestNode *)pBVar7);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
             "Verify line interpolation",1,0,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar10,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip",
             "Verify line strip interpolation",3,0,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1)
  ;
  tcu::TestNode::addChild(pTVar10,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop",
             "Verify line loop interpolation",2,0,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar10,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
             "Verify wide line interpolation",1,0,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar10,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip_wide",
             "Verify wide line strip interpolation",3,0,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(pTVar10,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop_wide",
             "Verify wide line loop interpolation",2,0,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(pTVar10,(TestNode *)pLVar11);
  pTVar10 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar10,((TestNode *)this)->m_testCtx,"projected",
             "Projective interpolation");
  tcu::TestNode::addChild(pTVar6,pTVar10);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
             "Verify triangle interpolation",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_02139f88;
  *(undefined4 *)&pBVar7->field_0xc4 = 4;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar7->m_flatshade = false;
  tcu::TestNode::addChild(pTVar10,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_strip",
             "Verify triangle strip interpolation",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_02139f88;
  *(undefined4 *)&pBVar7->field_0xc4 = 5;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar7->m_flatshade = false;
  tcu::TestNode::addChild(pTVar10,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_fan",
             "Verify triangle fan interpolation",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_02139f88;
  *(undefined4 *)&pBVar7->field_0xc4 = 6;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar7->m_flatshade = false;
  tcu::TestNode::addChild(pTVar10,(TestNode *)pBVar7);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
             "Verify line interpolation",1,2,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar10,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip",
             "Verify line strip interpolation",3,2,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1)
  ;
  tcu::TestNode::addChild(pTVar10,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop",
             "Verify line loop interpolation",2,2,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar10,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
             "Verify wide line interpolation",1,2,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar10,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip_wide",
             "Verify wide line strip interpolation",3,2,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(pTVar10,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop_wide",
             "Verify wide line loop interpolation",2,2,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(pTVar10,(TestNode *)pLVar11);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"flatshading","Test flatshading")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
             "Verify triangle flatshading",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_02139f88;
  *(undefined4 *)&pBVar7->field_0xc4 = 4;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar7->m_flatshade = true;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_strip",
             "Verify triangle strip flatshading",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_02139f88;
  *(undefined4 *)&pBVar7->field_0xc4 = 5;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar7->m_flatshade = true;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_fan",
             "Verify triangle fan flatshading",RENDERTARGET_DEFAULT,-1,0x100);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_02139f88;
  *(undefined4 *)&pBVar7->field_0xc4 = 6;
  *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 3;
  *(undefined1 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar7->m_flatshade = true;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
             "Verify line flatshading",1,4,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip",
             "Verify line strip flatshading",3,4,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop",
             "Verify line loop flatshading",2,4,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
             "Verify wide line flatshading",1,4,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip_wide",
             "Verify wide line strip flatshading",3,4,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1
            );
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop_wide",
             "Verify wide line loop flatshading",2,4,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1)
  ;
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar11);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"fbo",
             "Test using framebuffer objects");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pcVar14 = (char *)0x0;
  local_78 = pTVar6;
  do {
    pTVar6 = local_78;
    local_c8 = (TestNode *)operator_new(0x70);
    testCtx = ((TestNode *)this)->m_testCtx;
    __s = *(char **)(pcVar14 + 0x2139ab0);
    local_80 = pcVar14;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_70,__s,&local_c9);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1bf081a);
    local_c0 = &local_b0;
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_b0 = *plVar12;
      lStack_a8 = plVar8[3];
    }
    else {
      local_b0 = *plVar12;
      local_c0 = (long *)*plVar8;
    }
    local_b8 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_c0);
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_90 = *plVar12;
      lStack_88 = plVar8[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *plVar12;
      local_a0 = (long *)*plVar8;
    }
    local_98 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_c8,testCtx,__s,(char *)local_a0);
    pcVar14 = local_80;
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    pTVar10 = local_c8;
    tcu::TestNode::addChild(pTVar6,local_c8);
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"primitives",
               "Primitive rasterization");
    tcu::TestNode::addChild(pTVar10,pTVar6);
    pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
    target = *(RenderTarget *)(pcVar14 + 0x2139ab8);
    numSamples = *(int *)(pcVar14 + 0x2139abc);
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
               "Render primitives as GL_TRIANGLES, verify rasterization result",target,numSamples,
               0x100);
    *(undefined8 *)&pBVar7->field_0xc4 = 0x300000000;
    *(undefined4 *)
     ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 4;
    *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__BaseRenderingCase_02139b18;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
    pBVar7 = (BaseRenderingCase *)operator_new(0xf8);
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
               "Render primitives as GL_LINES, verify rasterization result",target,numSamples,0x100)
    ;
    *(undefined8 *)&pBVar7->field_0xc4 = 0x300000000;
    *(undefined8 *)
     ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 1;
    *(undefined2 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1
    ;
    *(undefined4 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
         0x3f800000;
    pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
    pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)
     ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__BaseLineCase_02139cc8;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
    pBVar7 = (BaseRenderingCase *)operator_new(0xf8);
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
               "Render primitives as GL_LINES with wide lines, verify rasterization result",target,
               numSamples,0x100);
    *(undefined8 *)&pBVar7->field_0xc4 = 0x300000000;
    *(undefined1 **)
     ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
         &DAT_100000001;
    *(undefined2 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1
    ;
    *(undefined4 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
         0x3f800000;
    pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
    pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)
     ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__BaseLineCase_02139cc8;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
    pBVar7 = (BaseRenderingCase *)operator_new(0xf0);
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"points",
               "Render primitives as GL_POINTS, verify rasterization result",target,numSamples,0x100
              );
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__PointCase_02139e68;
    *(undefined8 *)&pBVar7->field_0xc4 = 0x300000000;
    *(undefined4 *)
     ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 1;
    *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
    *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
         0x3f800000;
    pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
    pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
    pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"fill_rules",
               "Primitive fill rules");
    tcu::TestNode::addChild(local_c8,pTVar6);
    pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
    pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_02139ec8;
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar7,pCVar4,"basic_quad","Verify fill rules",target,numSamples,0x100);
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_02139ec8;
    *(undefined8 *)&pBVar7->field_0xc4 = 0;
    *(undefined4 *)
     ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 2;
    *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
    pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
    pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_02139ec8;
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar7,pCVar4,"basic_quad_reverse","Verify fill rules",target,numSamples,0x100);
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_02139ec8;
    *(undefined8 *)&pBVar7->field_0xc4 = 1;
    *(undefined4 *)
     ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 2;
    *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
    pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
    pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_02139ec8;
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar7,pCVar4,"clipped_full","Verify fill rules",target,numSamples,0x40);
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_02139ec8;
    *(undefined8 *)&pBVar7->field_0xc4 = 2;
    *(undefined4 *)
     ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 0xf;
    *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
    pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
    pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_02139ec8;
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar7,pCVar4,"clipped_partly","Verify fill rules",target,numSamples,0x40);
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_02139ec8;
    *(undefined8 *)&pBVar7->field_0xc4 = 3;
    *(undefined4 *)
     ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 0xf;
    *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
    pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
    pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_02139ec8;
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar7,pCVar4,"projected","Verify fill rules",target,numSamples,0x100);
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FillRuleCase_02139ec8;
    *(undefined8 *)&pBVar7->field_0xc4 = 4;
    *(undefined4 *)
     ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 2;
    *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"interpolation",
               "Non-projective interpolation");
    tcu::TestNode::addChild(local_c8,pTVar6);
    pBVar7 = (BaseRenderingCase *)operator_new(0xd8);
    anon_unknown_1::BaseRenderingCase::BaseRenderingCase
              (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
               "Verify triangle interpolation",target,numSamples,0x100);
    (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TriangleInterpolationTest_02139f88;
    *(undefined4 *)&pBVar7->field_0xc4 = 4;
    *(undefined1 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
    *(undefined8 *)
     ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 3;
    *(undefined1 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1
    ;
    pBVar7->m_flatshade = false;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
    pLVar11 = (LineInterpolationTest *)operator_new(0x148);
    anon_unknown_1::LineInterpolationTest::LineInterpolationTest
              (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
               "Verify line interpolation",1,0,PRIMITIVEWIDENESS_NARROW,target,numSamples);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar11);
    pLVar11 = (LineInterpolationTest *)operator_new(0x148);
    anon_unknown_1::LineInterpolationTest::LineInterpolationTest
              (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
               "Verify wide line interpolation",1,0,PRIMITIVEWIDENESS_WIDE,target,numSamples);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar11);
    pcVar14 = local_80 + 0x10;
    this = (RasterizationTests *)local_50;
  } while (pcVar14 != (char *)0x40);
  return extraout_EAX;
}

Assistant:

void RasterizationTests::init (void)
{
	// .primitives
	{
		tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(m_testCtx, "primitives", "Primitive rasterization");

		addChild(primitives);

		primitives->addChild(new TrianglesCase		(m_context, "triangles",		"Render primitives as GL_TRIANGLES, verify rasterization result"));
		primitives->addChild(new TriangleStripCase	(m_context, "triangle_strip",	"Render primitives as GL_TRIANGLE_STRIP, verify rasterization result"));
		primitives->addChild(new TriangleFanCase	(m_context, "triangle_fan",		"Render primitives as GL_TRIANGLE_FAN, verify rasterization result"));
		primitives->addChild(new LinesCase			(m_context, "lines",			"Render primitives as GL_LINES, verify rasterization result",							PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LineStripCase		(m_context, "line_strip",		"Render primitives as GL_LINE_STRIP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LineLoopCase		(m_context, "line_loop",		"Render primitives as GL_LINE_LOOP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LinesCase			(m_context, "lines_wide",		"Render primitives as GL_LINES with wide lines, verify rasterization result",			PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new LineStripCase		(m_context, "line_strip_wide",	"Render primitives as GL_LINE_STRIP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new LineLoopCase		(m_context, "line_loop_wide",	"Render primitives as GL_LINE_LOOP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new PointCase			(m_context, "points",			"Render primitives as GL_POINTS, verify rasterization result",							PRIMITIVEWIDENESS_WIDE));
	}

	// .fill_rules
	{
		tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(m_testCtx, "fill_rules", "Primitive fill rules");

		addChild(fillRules);

		fillRules->addChild(new FillRuleCase(m_context,	"basic_quad",			"Verify fill rules",	FillRuleCase::FILLRULECASE_BASIC));
		fillRules->addChild(new FillRuleCase(m_context,	"basic_quad_reverse",	"Verify fill rules",	FillRuleCase::FILLRULECASE_REVERSED));
		fillRules->addChild(new FillRuleCase(m_context,	"clipped_full",			"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_FULL));
		fillRules->addChild(new FillRuleCase(m_context,	"clipped_partly",		"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_PARTIAL));
		fillRules->addChild(new FillRuleCase(m_context,	"projected",			"Verify fill rules",	FillRuleCase::FILLRULECASE_PROJECTED));
	}

	// .culling
	{
		static const struct CullMode
		{
			glw::GLenum	mode;
			const char*	prefix;
		} cullModes[] =
		{
			{ GL_FRONT,				"front_"	},
			{ GL_BACK,				"back_"		},
			{ GL_FRONT_AND_BACK,	"both_"		},
		};
		static const struct PrimitiveType
		{
			glw::GLenum	type;
			const char*	name;
		} primitiveTypes[] =
		{
			{ GL_TRIANGLES,			"triangles"			},
			{ GL_TRIANGLE_STRIP,	"triangle_strip"	},
			{ GL_TRIANGLE_FAN,		"triangle_fan"		},
		};
		static const struct FrontFaceOrder
		{
			glw::GLenum	mode;
			const char*	postfix;
		} frontOrders[] =
		{
			{ GL_CCW,	""			},
			{ GL_CW,	"_reverse"	},
		};

		tcu::TestCaseGroup* const culling = new tcu::TestCaseGroup(m_testCtx, "culling", "Culling");

		addChild(culling);

		for (int cullModeNdx   = 0; cullModeNdx   < DE_LENGTH_OF_ARRAY(cullModes);      ++cullModeNdx)
		for (int primitiveNdx  = 0; primitiveNdx  < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveNdx)
		for (int frontOrderNdx = 0; frontOrderNdx < DE_LENGTH_OF_ARRAY(frontOrders);    ++frontOrderNdx)
		{
			const std::string name = std::string(cullModes[cullModeNdx].prefix) + primitiveTypes[primitiveNdx].name + frontOrders[frontOrderNdx].postfix;

			culling->addChild(new CullingTest(m_context, name.c_str(), "Test primitive culling.", cullModes[cullModeNdx].mode, primitiveTypes[primitiveNdx].type, frontOrders[frontOrderNdx].mode));
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Test interpolation");

		addChild(interpolation);

		// .basic
		{
			tcu::TestCaseGroup* const basic = new tcu::TestCaseGroup(m_testCtx, "basic", "Non-projective interpolation");

			interpolation->addChild(basic);

			basic->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTest		(m_context, "triangle_strip",	"Verify triangle strip interpolation",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTest		(m_context, "triangle_fan",		"Verify triangle fan interpolation",	GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTest			(m_context, "line_strip",		"Verify line strip interpolation",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTest			(m_context, "line_loop",		"Verify line loop interpolation",		GL_LINE_LOOP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
			basic->addChild(new LineInterpolationTest			(m_context, "line_strip_wide",	"Verify wide line strip interpolation",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
			basic->addChild(new LineInterpolationTest			(m_context, "line_loop_wide",	"Verify wide line loop interpolation",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
		}

		// .projected
		{
			tcu::TestCaseGroup* const projected = new tcu::TestCaseGroup(m_testCtx, "projected", "Projective interpolation");

			interpolation->addChild(projected);

			projected->addChild(new TriangleInterpolationTest	(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTest	(m_context, "triangle_strip",	"Verify triangle strip interpolation",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTest	(m_context, "triangle_fan",		"Verify triangle fan interpolation",	GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new LineInterpolationTest		(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTest		(m_context, "line_strip",		"Verify line strip interpolation",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTest		(m_context, "line_loop",		"Verify line loop interpolation",		GL_LINE_LOOP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTest		(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
			projected->addChild(new LineInterpolationTest		(m_context, "line_strip_wide",	"Verify wide line strip interpolation",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
			projected->addChild(new LineInterpolationTest		(m_context, "line_loop_wide",	"Verify wide line loop interpolation",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
		}
	}

	// .flatshading
	{
		tcu::TestCaseGroup* const flatshading = new tcu::TestCaseGroup(m_testCtx, "flatshading", "Test flatshading");

		addChild(flatshading);

		flatshading->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle flatshading",			GL_TRIANGLES,		INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTest		(m_context, "triangle_strip",	"Verify triangle strip flatshading",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTest		(m_context, "triangle_fan",		"Verify triangle fan flatshading",		GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line flatshading",				GL_LINES,			INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_strip",		"Verify line strip flatshading",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_loop",		"Verify line loop flatshading",			GL_LINE_LOOP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line flatshading",			GL_LINES,			INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_strip_wide",	"Verify wide line strip flatshading",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_loop_wide",	"Verify wide line loop flatshading",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
	}

	// .fbo
	{
		static const struct
		{
			const char*						name;
			BaseRenderingCase::RenderTarget	target;
			int								numSamples;
		} renderTargets[] =
		{
			{ "texture_2d",				BaseRenderingCase::RENDERTARGET_TEXTURE_2D,			-1									},
			{ "rbo_singlesample",		BaseRenderingCase::RENDERTARGET_RBO_SINGLESAMPLE,	-1									},
			{ "rbo_multisample_4",		BaseRenderingCase::RENDERTARGET_RBO_MULTISAMPLE,	4									},
			{ "rbo_multisample_max",	BaseRenderingCase::RENDERTARGET_RBO_MULTISAMPLE,	BaseRenderingCase::SAMPLE_COUNT_MAX	},
		};

		tcu::TestCaseGroup* const fboGroup = new tcu::TestCaseGroup(m_testCtx, "fbo", "Test using framebuffer objects");
		addChild(fboGroup);

		// .texture_2d
		// .rbo_singlesample
		// .rbo_multisample_4
		// .rbo_multisample_max
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(renderTargets); ++targetNdx)
		{
			tcu::TestCaseGroup* const colorAttachmentGroup = new tcu::TestCaseGroup(m_testCtx, renderTargets[targetNdx].name, ("Test using " + std::string(renderTargets[targetNdx].name) + " color attachment").c_str());
			fboGroup->addChild(colorAttachmentGroup);

			// .primitives
			{
				tcu::TestCaseGroup* const primitiveGroup = new tcu::TestCaseGroup(m_testCtx, "primitives", "Primitive rasterization");
				colorAttachmentGroup->addChild(primitiveGroup);

				primitiveGroup->addChild(new TrianglesCase	(m_context, "triangles",	"Render primitives as GL_TRIANGLES, verify rasterization result",											renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				primitiveGroup->addChild(new LinesCase		(m_context, "lines",		"Render primitives as GL_LINES, verify rasterization result",					PRIMITIVEWIDENESS_NARROW,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				primitiveGroup->addChild(new LinesCase		(m_context, "lines_wide",	"Render primitives as GL_LINES with wide lines, verify rasterization result",	PRIMITIVEWIDENESS_WIDE,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				primitiveGroup->addChild(new PointCase		(m_context, "points",		"Render primitives as GL_POINTS, verify rasterization result",					PRIMITIVEWIDENESS_WIDE,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
			}

			// .fill_rules
			{
				tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(m_testCtx, "fill_rules", "Primitive fill rules");

				colorAttachmentGroup->addChild(fillRules);

				fillRules->addChild(new FillRuleCase(m_context,	"basic_quad",			"Verify fill rules",	FillRuleCase::FILLRULECASE_BASIC,			renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"basic_quad_reverse",	"Verify fill rules",	FillRuleCase::FILLRULECASE_REVERSED,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"clipped_full",			"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_FULL,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"clipped_partly",		"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_PARTIAL,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"projected",			"Verify fill rules",	FillRuleCase::FILLRULECASE_PROJECTED,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
			}

			// .interpolation
			{
				tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Non-projective interpolation");

				colorAttachmentGroup->addChild(interpolation);

				interpolation->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_NONE,								renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				interpolation->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				interpolation->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
			}
		}
	}
}